

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

void __thiscall
GeneratorProfile_defaultGeneralValues_Test::TestBody
          (GeneratorProfile_defaultGeneralValues_Test *this)

{
  undefined1 uVar1;
  char *pcVar2;
  Profile local_50 [2];
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  GeneratorProfilePtr generatorProfile;
  
  libcellml::GeneratorProfile::create((Profile)&generatorProfile);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_3_ = 0;
  local_50[0] = libcellml::GeneratorProfile::profile();
  testing::internal::
  CmpHelperEQ<libcellml::GeneratorProfile::Profile,libcellml::GeneratorProfile::Profile>
            ((internal *)&gtest_ar,"libcellml::GeneratorProfile::Profile::C",
             "generatorProfile->profile()",(Profile *)&gtest_ar_1,local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::profile();
  libcellml::GeneratorProfile::profileAsString_abi_cxx11_((Profile)&gtest_ar);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"c\"",
             "libcellml::GeneratorProfile::profileAsString(generatorProfile->profile())",
             (char (*) [2])0x155a5b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  uVar1 = libcellml::GeneratorProfile::hasInterface();
  local_50[0] = CONCAT31(local_50[0]._1_3_,uVar1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"true","generatorProfile->hasInterface()",&gtest_ar_1.success_,
             (bool *)local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generatorProfile.
              super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(GeneratorProfile, defaultGeneralValues)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    EXPECT_EQ(libcellml::GeneratorProfile::Profile::C, generatorProfile->profile());
    EXPECT_EQ("c", libcellml::GeneratorProfile::profileAsString(generatorProfile->profile()));

    EXPECT_EQ(true, generatorProfile->hasInterface());
}